

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O3

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::send_msg_to_leader
          (raft_server *this,ptr<req_msg> *req,req_ext_params *ext_params)

{
  ulong *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__position;
  uint uVar2;
  cmd_result_code code;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  char cVar12;
  int iVar13;
  iterator iVar14;
  element_type *peVar15;
  mapped_type *pmVar16;
  element_type *peVar17;
  element_type *peVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  char *pcVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  ulong uVar20;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *__tmp_1;
  bool bVar22;
  ptr<resp_msg> pVar23;
  ptr<cmd_result<ptr<buffer>_>_> pVar24;
  ptr<cmd_result<ptr<buffer>_>_> *presult;
  int32 leader_id;
  __node_gen_type __node_gen;
  ptr<buffer> result;
  rpc_handler handler;
  unique_lock<std::mutex> l;
  ptr<raft_params> params;
  ptr<cluster_config> c_conf;
  uint local_11c;
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  element_type *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_c8 [16];
  shared_ptr<nuraft::rpc_client> local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [40];
  unique_lock<std::mutex> local_60;
  undefined1 local_50 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_11c = *(uint *)((long)&req[3].
                               super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 4);
  local_a8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8._8_8_ = (element_type *)0x0;
  local_88._24_8_ = ext_params;
  if (local_11c == 0xffffffff) {
    p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar13 = (*p_Var4->_vptr__Sp_counted_base[7])(), 3 < iVar13)) {
      p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      msg_if_given_abi_cxx11_
                ((string *)local_118,"return null as leader does not exist in the current group");
      (*p_Var4->_vptr__Sp_counted_base[8])
                (p_Var4,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                 ,"send_msg_to_leader",0x77,local_118);
      if ((ptr<resp_msg> *)local_118._0_8_ != (ptr<resp_msg> *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_);
      }
    }
    peVar15 = (element_type *)operator_new(0xe0);
LAB_001da5b6:
    (peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x100000001;
    peVar15->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c47f8;
    p_Var21 = &(peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
               super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::cmd_result
              ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
               p_Var21,(shared_ptr<nuraft::buffer> *)(local_118 + 0x70),NOT_LEADER);
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar15;
    this->_vptr_raft_server = (_func_int **)p_Var21;
    pcVar19 = (char *)extraout_RDX_02;
  }
  else {
    if (local_11c ==
        *(uint *)&req[3].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi) {
      (**(code **)&(((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                   ->super_msg_base).type_)
                (local_118 + 0x80,req,
                 *(undefined8 *)&(ext_params->after_precommit_).super__Function_base._M_functor);
      if ((_Atomic_word *)local_98._0_8_ == (_Atomic_word *)0x0) {
        p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar13 = (*p_Var4->_vptr__Sp_counted_base[7])(), 3 < iVar13)) {
          p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_((string *)local_118,"server returns null");
          (*p_Var4->_vptr__Sp_counted_base[8])
                    (p_Var4,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0x80,local_118);
          if ((ptr<resp_msg> *)local_118._0_8_ != (ptr<resp_msg> *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        peVar15 = (element_type *)operator_new(0xe0);
        (peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x100000001;
        peVar15->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c47f8;
        p_Var21 = &(peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::cmd_result
                  ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                   p_Var21,(shared_ptr<nuraft::buffer> *)(local_118 + 0x70),BAD_REQUEST);
        (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar15;
        this->_vptr_raft_server = (_func_int **)p_Var21;
        pcVar19 = (char *)extraout_RDX_03;
        local_50._8_8_ = local_98._8_8_;
      }
      else {
        this->_vptr_raft_server = (_func_int **)0x0;
        (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        pcVar19 = (char *)extraout_RDX;
        if (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._0_8_ + 0x68))->_M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pVar23 = resp_msg::call_cb((resp_msg *)local_118,(ptr<resp_msg> *)local_98._0_8_);
          uVar9 = local_98._8_8_;
          local_98._8_8_ = local_118._8_8_;
          local_98._0_8_ = local_118._0_8_;
          pcVar19 = (char *)pVar23.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
          local_118._0_8_ = (_Atomic_word *)0x0;
          local_118._8_8_ = (element_type *)0x0;
          if (((element_type *)uVar9 != (element_type *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9),
             pcVar19 = (char *)extraout_RDX_00,
             (element_type *)local_118._8_8_ != (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
            pcVar19 = (char *)extraout_RDX_01;
          }
        }
        uVar9 = local_a8._8_8_;
        if (*(char *)&(((ptr<resp_msg> *)(local_98._0_8_ + 0x30))->
                      super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
            '\x01') {
          local_a8._0_8_ =
               ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._0_8_ + 0x38))->_M_pi;
          peVar3 = (((ptr<resp_msg> *)(local_98._0_8_ + 0x40))->
                   super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (peVar3 != (element_type *)0x0) {
            pcVar19 = &__libc_single_threaded;
            if (__libc_single_threaded == '\0') {
              LOCK();
              puVar1 = &(peVar3->super_msg_base).term_;
              *(int *)puVar1 = (int)*puVar1 + 1;
              UNLOCK();
            }
            else {
              puVar1 = &(peVar3->super_msg_base).term_;
              *(int *)puVar1 = (int)*puVar1 + 1;
            }
          }
          bVar22 = (element_type *)local_a8._8_8_ != (element_type *)0x0;
          local_a8._8_8_ = peVar3;
          if (bVar22) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9);
            pcVar19 = (char *)extraout_RDX_04;
          }
          if (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._0_8_ + 0x88))->_M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            (*(code *)(((ptr<resp_msg> *)(local_98._0_8_ + 0x90))->
                      super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      (local_118);
            uVar10 = local_118._8_8_;
            uVar9 = local_118._0_8_;
            local_118._0_8_ = (_Atomic_word *)0x0;
            local_118._8_8_ = (element_type *)0x0;
            peVar15 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            this->_vptr_raft_server = (_func_int **)uVar9;
            (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)uVar10;
            pcVar19 = (char *)extraout_RDX_05;
            if ((peVar15 != (element_type *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15),
               pcVar19 = (char *)extraout_RDX_06,
               (element_type *)local_118._8_8_ != (element_type *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
              pcVar19 = (char *)extraout_RDX_07;
            }
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          buffer::pos((buffer *)local_a8._0_8_,0);
          pcVar19 = (char *)extraout_RDX_08;
        }
        local_50._8_8_ = local_98._8_8_;
        if (this->_vptr_raft_server == (_func_int **)0x0) {
          bVar22 = *(bool *)&(((ptr<resp_msg> *)(local_98._0_8_ + 0x30))->
                             super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr;
          code = *(cmd_result_code *)
                  &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._0_8_ + 0x98))->_M_pi;
          peVar18 = (element_type *)operator_new(0xe0);
          (peVar18->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x100000001;
          peVar18->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c47f8;
          p_Var21 = &(peVar18->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                     super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::cmd_result
                    ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                      *)p_Var21,(shared_ptr<nuraft::buffer> *)(local_118 + 0x70),bVar22,code);
          this->_vptr_raft_server = (_func_int **)p_Var21;
          peVar15 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar18;
          pcVar19 = (char *)extraout_RDX_09;
          local_50._8_8_ = local_98._8_8_;
          if (peVar15 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar15);
            pcVar19 = (char *)extraout_RDX_10;
            local_50._8_8_ = local_98._8_8_;
          }
        }
      }
    }
    else {
      context::get_params((context *)local_118);
      cVar12 = *(char *)(local_118._0_8_ + 0x49);
      if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
      if (cVar12 == '\0') {
        peVar15 = (element_type *)operator_new(0xe0);
        goto LAB_001da5b6;
      }
      context::get_params((context *)local_50);
      uVar2 = *(uint *)((long)&((element_type *)(local_50._0_8_ + 0x48))->_vptr_state_mgr + 4);
      local_88._36_4_ = *(undefined4 *)&((element_type *)(local_50._0_8_ + 0x58))->_vptr_state_mgr;
      uVar20 = 1;
      if (1 < (int)uVar2) {
        uVar20 = (ulong)uVar2;
      }
      get_config((raft_server *)(local_50 + 0x10));
      local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8._8_8_ = (element_type *)0x0;
      iVar13 = pthread_mutex_lock((pthread_mutex_t *)(req + 0x4b));
      if (iVar13 != 0) {
        std::__throw_system_error(iVar13);
      }
      iVar14 = std::
               _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)(req + 0x25),(key_type_conflict *)&local_11c);
      if (iVar14.
          super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_118._0_8_ = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<nuraft::raft_server::auto_fwd_pkg,std::allocator<nuraft::raft_server::auto_fwd_pkg>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
                   (auto_fwd_pkg **)local_118,
                   (allocator<nuraft::raft_server::auto_fwd_pkg> *)(local_118 + 0x80));
        uVar9 = local_c8._8_8_;
        local_c8._8_8_ = local_118._8_8_;
        local_c8._0_8_ = local_118._0_8_;
        local_118._0_8_ = (_Atomic_word *)0x0;
        local_118._8_8_ = (element_type *)0x0;
        if (((element_type *)uVar9 != (element_type *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9),
           (element_type *)local_118._8_8_ != (element_type *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
        pmVar16 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)(req + 0x25),(key_type *)&local_11c);
        (pmVar16->super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>)
        ._M_ptr = (element_type *)local_c8._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar16->
                    super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 0x58));
        p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar13 = (*p_Var4->_vptr__Sp_counted_base[7])(), 5 < iVar13)) {
          p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_118,"auto forwarding pkg for leader %d not found, created %p",
                     (ulong)local_11c,local_c8._0_8_);
          (*p_Var4->_vptr__Sp_counted_base[8])
                    (p_Var4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0xbb,local_118);
          goto LAB_001da796;
        }
      }
      else {
        local_c8._0_8_ =
             *(undefined8 *)
              ((long)iVar14.
                     super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false>
                     ._M_cur + 0x10);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 0x58),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)iVar14.
                          super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false>
                          ._M_cur + 0x18));
        p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar13 = (*p_Var4->_vptr__Sp_counted_base[7])(), 5 < iVar13)) {
          p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_118,"auto forwarding pkg for leader %d exists %p",
                     (ulong)local_11c,local_c8._0_8_);
          (*p_Var4->_vptr__Sp_counted_base[8])
                    (p_Var4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0xbf,local_118);
LAB_001da796:
          if ((ptr<resp_msg> *)local_118._0_8_ != (ptr<resp_msg> *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)(req + 0x4b));
      while( true ) {
        local_60._M_device = (mutex_type *)(local_c8._0_8_ + 0x50);
        local_60._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_60);
        local_60._M_owns = true;
        peVar5 = (element_type *)
                 (((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                    *)local_c8._0_8_)->
                 super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (peVar5 != (element_type *)local_c8._0_8_) break;
        p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar13 = (*p_Var4->_vptr__Sp_counted_base[7])(), 5 < iVar13)) {
          p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_118,"no connection available, idle %zu, in-use %zu, max %zu",
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._0_8_ + 0x10))->
                     _vptr__Sp_counted_base,
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._0_8_ + 0x30))->
                     _vptr__Sp_counted_base,uVar20);
          (*p_Var4->_vptr__Sp_counted_base[8])
                    (p_Var4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0xce,(string *)local_118);
          if ((ptr<resp_msg> *)local_118._0_8_ != (ptr<resp_msg> *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        if ((ulong)((long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._0_8_ + 0x30))
                          ->_vptr__Sp_counted_base +
                   (long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._0_8_ + 0x10))->
                         _vptr__Sp_counted_base) < uVar20) {
          peVar17 = (element_type *)(local_50._16_8_ + 0x38);
          do {
            peVar17 = (element_type *)peVar17->_vptr_state_machine;
            pp_Var6 = peVar17[2]._vptr_state_machine;
          } while (*(uint *)pp_Var6 != local_11c);
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar17[3]._vptr_state_machine;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          pp_Var7 = req[0x15].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi[4]._vptr__Sp_counted_base;
          (**(code **)(*pp_Var7 + 0x10))(local_118,pp_Var7,pp_Var6 + 1);
          _Var11._M_pi = local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
          local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
          local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_118._0_8_;
          local_118._0_8_ = (_func_int **)0x0;
          local_118._8_8_ = (element_type *)0x0;
          if (((element_type *)_Var11._M_pi != (element_type *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var11._M_pi),
             (element_type *)local_118._8_8_ != (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
          }
          local_118._0_8_ =
               &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._0_8_ + 0x10))->
                _M_use_count;
          std::
          _Hashtable<std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::rpc_client>,std::allocator<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<nuraft::rpc_client>>,std::hash<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<std::shared_ptr<nuraft::rpc_client>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<nuraft::rpc_client>,false>>>>
                    ((_Hashtable<std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::rpc_client>,std::allocator<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<nuraft::rpc_client>>,std::hash<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_118._0_8_,local_118 + 0x60);
          p_Var8 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (iVar13 = (*p_Var8->_vptr__Sp_counted_base[7])(), 5 < iVar13)) {
            p_Var8 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            msg_if_given_abi_cxx11_
                      ((string *)local_118,"created a new connection %p",
                       local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            (*p_Var8->_vptr__Sp_counted_base[8])
                      (p_Var8,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                       ,"send_msg_to_leader",0xd6,local_118);
            if ((ptr<resp_msg> *)local_118._0_8_ != (ptr<resp_msg> *)(local_118 + 0x10)) {
              operator_delete((void *)local_118._0_8_);
            }
          }
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          goto LAB_001daf14;
        }
        if (local_88._36_4_ != 0) {
          local_118._8_8_ = (element_type *)0x0;
          local_108._M_allocated_capacity = 0;
          local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_118._0_8_ =
               *(undefined8 *)&(((req_ext_cb *)local_88._24_8_)->super__Function_base)._M_functor;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88._24_8_ + 8));
          peVar15 = (element_type *)operator_new(0xe0);
          (peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x100000001;
          peVar15->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c47f8;
          p_Var21 = &(peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                     super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          (peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (peVar15->bg_commit_thread_)._M_id._M_thread = 0;
          (peVar15->bg_append_thread_)._M_id._M_thread = 0;
          peVar15->bg_append_ea_ = (EventAwaiter *)0x0;
          *(undefined8 *)&(peVar15->initialized_)._M_base = 0;
          peVar15->id_ = 0;
          peVar15->my_priority_ = 0;
          *(undefined8 *)((long)&peVar15->my_priority_ + 2) = 0;
          (peVar15->priority_change_timer_).t_created_.__d.__r = 0;
          (peVar15->priority_change_timer_).duration_us_ = 0;
          *(undefined8 *)&(peVar15->priority_change_timer_).first_event_fired_ = 0;
          (peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
          *(undefined8 *)
           ((long)&(peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
          *(undefined8 *)
           ((long)&(peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
          (peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
               (__pthread_internal_list *)0x0;
          (peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
               (__pthread_internal_list *)0x0;
          peVar15->votes_responded_ = 0;
          peVar15->votes_granted_ = 0;
          (peVar15->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
          (peVar15->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
          (peVar15->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
          (peVar15->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
          std::condition_variable::condition_variable
                    ((condition_variable *)&peVar15->lagging_sm_target_index_);
          uVar9 = local_108._8_8_;
          bVar22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_108._M_allocated_capacity = (size_type)p_Var21;
          local_108._8_8_ = peVar15;
          if (bVar22) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9);
          }
          iVar13 = pthread_mutex_lock((pthread_mutex_t *)(req + 0x2a));
          if (iVar13 != 0) {
            std::__throw_system_error(iVar13);
          }
          __position = &req[0x28].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
          std::__cxx11::
          list<nuraft::raft_server::auto_fwd_req_resp,std::allocator<nuraft::raft_server::auto_fwd_req_resp>>
          ::_M_insert<nuraft::raft_server::auto_fwd_req_resp_const&>
                    ((list<nuraft::raft_server::auto_fwd_req_resp,std::allocator<nuraft::raft_server::auto_fwd_req_resp>>
                      *)__position,(iterator)__position,(auto_fwd_req_resp *)local_118);
          p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (iVar13 = (*p_Var4->_vptr__Sp_counted_base[7])(), 5 < iVar13)) {
            p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            msg_if_given_abi_cxx11_
                      ((string *)(local_118 + 0x80),
                       "reached max connection, put into the queue, %zu elems",
                       req[0x29].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            (*p_Var4->_vptr__Sp_counted_base[8])
                      (p_Var4,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                       ,"send_msg_to_leader",0xec,local_118 + 0x80);
            if ((ptr<resp_msg> *)local_98._0_8_ != (ptr<resp_msg> *)local_88) {
              operator_delete((void *)local_98._0_8_);
            }
          }
          this->_vptr_raft_server = (_func_int **)local_108._M_allocated_capacity;
          (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_108._8_8_;
          if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)(local_108._8_8_ + 8))->
                       _M_weak_this).
                       super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)(local_108._8_8_ + 8))
                            ->_M_weak_this).
                            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)(local_108._8_8_ + 8))->
                       _M_weak_this).
                       super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)(local_108._8_8_ + 8))
                            ->_M_weak_this).
                            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
            }
          }
          pthread_mutex_unlock((pthread_mutex_t *)(req + 0x2a));
          if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
          }
          if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
          }
          std::unique_lock<std::mutex>::~unique_lock(&local_60);
          pcVar19 = (char *)extraout_RDX_11;
          goto LAB_001db107;
        }
        std::unique_lock<std::mutex>::unlock(&local_60);
        p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar13 = (*p_Var4->_vptr__Sp_counted_base[7])(), 5 < iVar13)) {
          p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_((string *)local_118,"reached max connection, wait");
          (*p_Var4->_vptr__Sp_counted_base[8])
                    (p_Var4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0xdd,(string *)local_118);
          if ((ptr<resp_msg> *)local_118._0_8_ != (ptr<resp_msg> *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        EventAwaiter::wait_us
                  ((EventAwaiter *)
                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._0_8_ + 0x70))->
                    _M_use_count,
                   (long)*(int *)((long)&((element_type *)(local_50._0_8_ + 0x28))->_vptr_state_mgr
                                 + 4) * 1000);
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._0_8_ + 0x70))->_M_use_count = 0;
        UNLOCK();
        p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar13 = (*p_Var4->_vptr__Sp_counted_base[7])(), 5 < iVar13)) {
          p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_((string *)local_118,"wake up, find an available connection");
          (*p_Var4->_vptr__Sp_counted_base[8])
                    (p_Var4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0xe0,(string *)local_118);
          if ((ptr<resp_msg> *)local_118._0_8_ != (ptr<resp_msg> *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_60);
      }
      local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (peVar5->rpc_client_idle_).
           super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
           ._M_impl._M_node._M_size;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 0x68),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&peVar5->rpc_client_in_use_);
      cVar12 = (**(code **)(*(_func_int **)
                             local_b8.
                             super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 0x20))();
      if (cVar12 != '\0') {
        peVar17 = (element_type *)(local_50._16_8_ + 0x38);
        do {
          peVar17 = (element_type *)peVar17->_vptr_state_machine;
          pp_Var6 = peVar17[2]._vptr_state_machine;
        } while (*(uint *)pp_Var6 != local_11c);
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar17[3]._vptr_state_machine;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        pp_Var7 = req[0x15].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[4]._vptr__Sp_counted_base;
        (**(code **)(*pp_Var7 + 0x10))(local_118,pp_Var7,pp_Var6 + 1);
        _Var11._M_pi = local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
        local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_118._0_8_;
        local_118._0_8_ = (_Atomic_word *)0x0;
        local_118._8_8_ = (element_type *)0x0;
        if (((element_type *)_Var11._M_pi != (element_type *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var11._M_pi),
           (element_type *)local_118._8_8_ != (element_type *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
      }
      std::__cxx11::
      list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
      ::_M_erase((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                  *)local_c8._0_8_,
                 (((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                    *)local_c8._0_8_)->
                 super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next);
      local_118._0_8_ =
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8._0_8_ + 0x10))->_M_use_count;
      std::
      _Hashtable<std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::rpc_client>,std::allocator<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<nuraft::rpc_client>>,std::hash<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<std::shared_ptr<nuraft::rpc_client>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<nuraft::rpc_client>,false>>>>
                ((_Hashtable<std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::rpc_client>,std::allocator<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<nuraft::rpc_client>>,std::hash<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_118._0_8_,local_118 + 0x60);
      p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (iVar13 = (*p_Var4->_vptr__Sp_counted_base[7])(), 5 < iVar13)) {
        p_Var4 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_118,"idle connection %p",
                   local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        (*p_Var4->_vptr__Sp_counted_base[8])
                  (p_Var4,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                   ,"send_msg_to_leader",0xfb,local_118);
        if ((ptr<resp_msg> *)local_118._0_8_ != (ptr<resp_msg> *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_);
        }
      }
LAB_001daf14:
      std::unique_lock<std::mutex>::~unique_lock(&local_60);
      if (local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        peVar15 = (element_type *)operator_new(0xe0);
        (peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x100000001;
        peVar15->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c47f8;
        p_Var21 = &(peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::cmd_result
                  ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                   p_Var21,(shared_ptr<nuraft::buffer> *)(local_118 + 0x70),OK);
        (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar15;
        this->_vptr_raft_server = (_func_int **)p_Var21;
        pcVar19 = (char *)extraout_RDX_15;
      }
      else {
        peVar15 = (element_type *)operator_new(0xe0);
        (peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x100000001;
        peVar15->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c47f8;
        (peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (peVar15->bg_commit_thread_)._M_id._M_thread = 0;
        (peVar15->bg_append_thread_)._M_id._M_thread = 0;
        peVar15->bg_append_ea_ = (EventAwaiter *)0x0;
        peVar15->initialized_ = (__atomic_base<bool>)0x0;
        *(undefined3 *)&peVar15->field_0x31 = 0;
        peVar15->leader_ = (__atomic_base<int>)0x0;
        peVar15->id_ = 0;
        peVar15->my_priority_ = 0;
        *(undefined8 *)((long)&peVar15->my_priority_ + 2) = 0;
        (peVar15->priority_change_timer_).t_created_.__d.__r = 0;
        (peVar15->priority_change_timer_).duration_us_ = 0;
        *(undefined8 *)&(peVar15->priority_change_timer_).first_event_fired_ = 0;
        (peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
        *(undefined8 *)
         ((long)&(peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
        *(undefined8 *)
         ((long)&(peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
        (peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
             (__pthread_internal_list *)0x0;
        (peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
             (__pthread_internal_list *)0x0;
        peVar15->votes_responded_ = 0;
        peVar15->votes_granted_ = 0;
        (peVar15->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
        (peVar15->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
        (peVar15->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
        (peVar15->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
        std::condition_variable::condition_variable
                  ((condition_variable *)&peVar15->lagging_sm_target_index_);
        (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar15;
        this->_vptr_raft_server =
             (_func_int **)
             &(peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
              super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        local_118._0_8_ = auto_fwd_resp_handler;
        local_118._8_8_ = (element_type *)0x0;
        std::
        _Tuple_impl<1ul,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>>
        ::
        _Tuple_impl<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>&,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>&,std::shared_ptr<nuraft::rpc_client>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,void>
                  ((_Tuple_impl<1ul,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>>
                    *)(local_118 + 0x10),
                   (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                    *)this,(shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)(local_118 + 0x50),
                   (shared_ptr<nuraft::rpc_client> *)(local_118 + 0x60),
                   (_Placeholder<1> *)&std::placeholders::_1,
                   (_Placeholder<2> *)&std::placeholders::_2);
        local_98._0_8_ = 0;
        local_98._8_8_ = (element_type *)0x0;
        local_88._0_8_ = (_Invoker_type)0x0;
        local_88._8_8_ = 0;
        local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)req;
        local_98._0_8_ = operator_new(0x48);
        _Var11._M_pi = _Stack_f0._M_pi;
        uVar9 = local_108._8_8_;
        *(undefined8 *)local_98._0_8_ = local_118._0_8_;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._0_8_ + 8))->_M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
        local_108._8_8_ = (element_type *)0x0;
        (((ptr<resp_msg> *)(local_98._0_8_ + 0x10))->
        super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)local_108._M_allocated_capacity;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._0_8_ + 0x18))->_M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
        local_108._M_allocated_capacity = 0;
        _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (((ptr<resp_msg> *)(local_98._0_8_ + 0x20))->
        super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_f8;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._0_8_ + 0x28))->_M_pi =
             _Var11._M_pi;
        local_f8 = (element_type *)0x0;
        *(undefined4 *)
         &(((ptr<resp_msg> *)(local_98._0_8_ + 0x30))->
          super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_e8;
        *(undefined4 *)(local_98._0_8_ + 0x34) = uStack_e4;
        *(undefined4 *)
         &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._0_8_ + 0x38))->_M_pi = uStack_e0
        ;
        *(undefined4 *)(local_98._0_8_ + 0x3c) = uStack_dc;
        (((ptr<resp_msg> *)(local_98._0_8_ + 0x40))->
        super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)req;
        local_88._8_8_ =
             std::
             _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
             ::_M_invoke;
        local_88._0_8_ =
             std::
             _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
             ::_M_manager;
        (**(code **)(*(_func_int **)
                      local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 0x10))
                  (local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_88._24_8_,local_118 + 0x80,
                   (long)*(int *)((long)&((element_type *)(local_50._0_8_ + 0x58))->_vptr_state_mgr
                                 + 4));
        pcVar19 = (char *)extraout_RDX_12;
        if (*(int *)&((element_type *)(local_50._0_8_ + 0x58))->_vptr_state_mgr == 0) {
          cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::get
                    ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                      *)this->_vptr_raft_server);
          pcVar19 = (char *)extraout_RDX_13;
        }
        if ((_Invoker_type)local_88._0_8_ != (_Invoker_type)0x0) {
          (*(code *)local_88._0_8_)(local_118 + 0x80,local_118 + 0x80,3);
          pcVar19 = (char *)extraout_RDX_14;
        }
      }
LAB_001db107:
      if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        pcVar19 = (char *)extraout_RDX_16;
      }
      if ((element_type *)
          local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        pcVar19 = (char *)extraout_RDX_17;
      }
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        pcVar19 = (char *)extraout_RDX_18;
      }
    }
    if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
      pcVar19 = (char *)extraout_RDX_19;
    }
  }
  if ((element_type *)local_a8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    pcVar19 = (char *)extraout_RDX_20;
  }
  pVar24.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar19;
  pVar24.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar24.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::send_msg_to_leader
                                 ( ptr<req_msg>& req,
                                   const req_ext_params& ext_params )
{
    int32 leader_id = leader_;
    ptr<buffer> result = nullptr;
    if (leader_id == -1) {
        p_in("return null as leader does not exist in the current group");
        ptr< cmd_result< ptr<buffer> > > ret =
            cs_new< cmd_result< ptr<buffer> > >(result, cmd_result_code::NOT_LEADER);
        return ret;
    }

    if (leader_id == id_) {
        ptr<resp_msg> resp = process_req(*req, ext_params);
        if (!resp) {
            p_in("server returns null");
            ptr< cmd_result< ptr<buffer> > > ret =
                cs_new< cmd_result< ptr<buffer> > >(result, cmd_result_code::BAD_REQUEST);
            return ret;
        }

        ptr< cmd_result< ptr<buffer> > > ret = nullptr;
        if (resp->has_cb()) {
            // Blocking mode:
            //   If callback function exists, get new response message
            //   from the callback function.
            resp = resp->call_cb(resp);
        }

        if (resp->get_accepted()) {
            result = resp->get_ctx();

            if (resp->has_async_cb()) {
                // Async handler mode (only when accepted):
                //   Get handler (async_result) from the callback.
                ret = resp->call_async_cb();
            }
        }
        if (result) {
            result->pos(0);
        }

        if (!ret) {
            // In blocking mode,
            // we already have result when we reach here.
            ret = cs_new< cmd_result< ptr<buffer> > >
                  ( result, resp->get_accepted(), resp->get_result_code() );
        }
        return ret;
    }
    if (!ctx_->get_params()->auto_forwarding_) {
        // Auto-forwarding is disabled, return error.
        ptr< cmd_result< ptr<buffer> > > ret =
            cs_new< cmd_result< ptr<buffer> > >(result, cmd_result_code::NOT_LEADER);
        return ret;
    }

    // Otherwise: re-direct request to the current leader
    //            (not recommended).
    ptr<raft_params> params = ctx_->get_params();
    size_t max_conns =
        std::max(1, params->auto_forwarding_max_connections_);
    bool is_blocking_mode = (params->return_method_ == raft_params::blocking);

    ptr<cluster_config> c_conf = get_config();
    ptr<rpc_client> rpc_cli;
    ptr<auto_fwd_pkg> cur_pkg = nullptr;
    {
        auto_lock(rpc_clients_lock_);
        auto entry = auto_fwd_pkgs_.find(leader_id);
        if (entry == auto_fwd_pkgs_.end()) {
            cur_pkg = cs_new<auto_fwd_pkg>();
            auto_fwd_pkgs_[leader_id] = cur_pkg;
            p_tr("auto forwarding pkg for leader %d not found, created %p",
                 leader_id, cur_pkg.get());
        } else {
            cur_pkg = entry->second;
            p_tr("auto forwarding pkg for leader %d exists %p",
                 leader_id, cur_pkg.get());
        }
    }

    // Find available `rpc_cli`.
    do {
        std::unique_lock<std::mutex> l(cur_pkg->lock_);
        // Get an idle connection.
        auto e_rpc = cur_pkg->rpc_client_idle_.begin();
        if (e_rpc == cur_pkg->rpc_client_idle_.end()) {
            // Idle connection doesn't exist,
            // check the total number of connections.
            p_tr( "no connection available, idle %zu, in-use %zu, max %zu",
                   cur_pkg->rpc_client_idle_.size(),
                   cur_pkg->rpc_client_in_use_.size(),
                   max_conns );
            if ( cur_pkg->rpc_client_idle_.size() +
                 cur_pkg->rpc_client_in_use_.size() < max_conns ) {
                // We can create more connections.
                ptr<srv_config> srv_conf = c_conf->get_server(leader_id);
                rpc_cli = ctx_->rpc_cli_factory_->create_client
                          ( srv_conf->get_endpoint() );
                cur_pkg->rpc_client_in_use_.insert(rpc_cli);
                p_tr("created a new connection %p", rpc_cli.get());

            } else {
                // Already reached the max, wait for idle connection.
                if (is_blocking_mode) {
                    // Blocking mode, sleep here.
                    l.unlock();
                    p_tr("reached max connection, wait");
                    cur_pkg->ea_.wait_ms(params->client_req_timeout_);
                    cur_pkg->ea_.reset();
                    p_tr("wake up, find an available connection");
                    continue;

                } else {
                    // Async mode, put it into the queue, and return immediately.
                    auto_fwd_req_resp req_resp_pair;
                    req_resp_pair.req = req;
                    req_resp_pair.resp = cs_new< cmd_result< ptr<buffer> > >();

                    auto_lock(auto_fwd_reqs_lock_);
                    auto_fwd_reqs_.push_back(req_resp_pair);
                    p_tr("reached max connection, put into the queue, %zu elems",
                         auto_fwd_reqs_.size());
                    return req_resp_pair.resp;
                }
            }
        } else {
            // Put the idle connection to in-use list.
            rpc_cli = *e_rpc;
            if (rpc_cli->is_abandoned()) {
                // Abandoned connection, need to reconnect.
                ptr<srv_config> srv_conf = c_conf->get_server(leader_id);
                rpc_cli = ctx_->rpc_cli_factory_->create_client
                          ( srv_conf->get_endpoint() );
            }
            cur_pkg->rpc_client_idle_.pop_front();
            cur_pkg->rpc_client_in_use_.insert(rpc_cli);
            p_tr("idle connection %p", rpc_cli.get());
        }
        break;
    } while(true);

    if (!rpc_cli) {
        return cs_new< cmd_result< ptr<buffer> > >(result);
    }

    ptr< cmd_result< ptr<buffer> > >
        presult( cs_new< cmd_result< ptr<buffer> > >() );

    rpc_handler handler = std::bind( &raft_server::auto_fwd_resp_handler,
                                     this,
                                     presult,
                                     cur_pkg,
                                     rpc_cli,
                                     std::placeholders::_1,
                                     std::placeholders::_2 );
    rpc_cli->send(req, handler, params->auto_forwarding_req_timeout_);

    if (params->return_method_ == raft_params::blocking) {
        presult->get();
    }

    return presult;
}